

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeSqlInit(Rtree *pRtree,sqlite3 *db,char *zDb,char *zPrefix,int isCreate)

{
  long lVar1;
  sqlite3_str *psVar2;
  char *pcVar3;
  char **pzTail;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  char *zSql_1;
  int ii_1;
  sqlite3_str *p_1;
  char *zFormat;
  char *zSql;
  int ii;
  sqlite3_str *p;
  char *zCreate;
  int f;
  int i;
  int rc;
  sqlite3_stmt **appStmt [8];
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  sqlite3_str *in_stack_ffffffffffffff40;
  sqlite3_str *p_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  sqlite3 *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  sqlite3 *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  int local_4c;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0;
  memset(&local_48,0xaa,0x40);
  uVar6 = 0xaaaaaaaa;
  uVar5 = 5;
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  if (in_R8D != 0) {
    psVar2 = sqlite3_str_new(in_stack_ffffffffffffff50);
    sqlite3_str_appendf(psVar2,"CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno",
                        in_RDX,in_RCX);
    for (uVar4 = 0; (int)uVar4 < (int)(uint)*(byte *)(in_RDI + 0x29); uVar4 = uVar4 + 1) {
      sqlite3_str_appendf(psVar2,",a%d",(ulong)uVar4);
    }
    sqlite3_str_appendf(psVar2,");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);"
                        ,in_RDX,in_RCX);
    sqlite3_str_appendf(psVar2,
                        "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);",
                        in_RDX,in_RCX);
    sqlite3_str_appendf(psVar2,"INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",in_RDX,in_RCX,
                        (ulong)*(uint *)(in_RDI + 0x20));
    pcVar3 = sqlite3_str_finish(in_stack_ffffffffffffff40);
    if (pcVar3 == (char *)0x0) {
      local_4c = 7;
      goto LAB_00299a53;
    }
    local_4c = sqlite3_exec((sqlite3 *)CONCAT44(uVar6,uVar5),pcVar3,(sqlite3_callback)psVar2,
                            (void *)CONCAT44(uVar4,in_stack_ffffffffffffff68),
                            (char **)in_stack_ffffffffffffff60);
    sqlite3_free((void *)0x2996e5);
    if (local_4c != 0) goto LAB_00299a53;
    uVar8 = 0;
  }
  local_48 = in_RDI + 0x78;
  local_40 = in_RDI + 0x80;
  local_38 = in_RDI + 0x88;
  local_30 = in_RDI + 0x90;
  local_28 = in_RDI + 0x98;
  local_4c = rtreeQueryStat1((sqlite3 *)CONCAT44(in_R8D,uVar8),(Rtree *)CONCAT44(uVar6,uVar5));
  iVar7 = 0;
  while( true ) {
    uVar4 = in_stack_ffffffffffffff3c & 0xffffff;
    if (iVar7 < 8) {
      uVar4 = CONCAT13(local_4c == 0,(int3)in_stack_ffffffffffffff3c);
    }
    in_stack_ffffffffffffff3c = uVar4;
    if ((char)(in_stack_ffffffffffffff3c >> 0x18) == '\0') break;
    if ((iVar7 == 3) && (*(char *)(in_RDI + 0x29) != '\0')) {
      in_stack_ffffffffffffff58 =
           "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno"
      ;
    }
    else {
      in_stack_ffffffffffffff58 = rtreeSqlInit::azSql[iVar7];
    }
    in_stack_ffffffffffffff60 = (sqlite3 *)sqlite3_mprintf(in_stack_ffffffffffffff58,in_RDX,in_RCX);
    if (in_stack_ffffffffffffff60 == (sqlite3 *)0x0) {
      local_4c = 7;
    }
    else {
      local_4c = sqlite3_prepare_v3(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                    (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                    (uint)in_stack_ffffffffffffff50,
                                    (sqlite3_stmt **)
                                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                    (char **)in_stack_ffffffffffffff40);
    }
    sqlite3_free((void *)0x29988e);
    iVar7 = iVar7 + 1;
  }
  if ((*(char *)(in_RDI + 0x29) != '\0') && (local_4c != 7)) {
    pcVar3 = sqlite3_mprintf("SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",in_RDX,in_RCX);
    *(char **)(in_RDI + 0x60) = pcVar3;
    if (*(long *)(in_RDI + 0x60) == 0) {
      local_4c = 7;
    }
    else {
      psVar2 = sqlite3_str_new(in_stack_ffffffffffffff50);
      p_00 = (sqlite3_str *)&DAT_aaaaaaaaaaaaaaaa;
      sqlite3_str_appendf(psVar2,"UPDATE \"%w\".\"%w_rowid\"SET ",in_RDX,in_RCX);
      for (uVar4 = 0; (int)uVar4 < (int)(uint)*(byte *)(in_RDI + 0x29); uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          sqlite3_str_append(p_00,(char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),0);
        }
        if ((int)uVar4 < (int)(uint)*(byte *)(in_RDI + 0x2a)) {
          sqlite3_str_appendf(psVar2,"a%d=coalesce(?%d,a%d)",(ulong)uVar4,(ulong)(uVar4 + 2),
                              (ulong)uVar4);
        }
        else {
          sqlite3_str_appendf(psVar2,"a%d=?%d",(ulong)uVar4,(ulong)(uVar4 + 2));
        }
      }
      sqlite3_str_appendf(psVar2," WHERE rowid=?1");
      pzTail = (char **)sqlite3_str_finish(p_00);
      if (pzTail == (char **)0x0) {
        local_4c = 7;
      }
      else {
        local_4c = sqlite3_prepare_v3(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                      (int)((ulong)psVar2 >> 0x20),(uint)psVar2,
                                      (sqlite3_stmt **)CONCAT44(uVar4,in_stack_ffffffffffffff48),
                                      pzTail);
        sqlite3_free((void *)0x299a47);
      }
    }
  }
LAB_00299a53:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

static int rtreeSqlInit(
  Rtree *pRtree,
  sqlite3 *db,
  const char *zDb,
  const char *zPrefix,
  int isCreate
){
  int rc = SQLITE_OK;

  #define N_STATEMENT 8
  static const char *azSql[N_STATEMENT] = {
    /* Write the xxx_node table */
    "INSERT OR REPLACE INTO '%q'.'%q_node' VALUES(?1, ?2)",
    "DELETE FROM '%q'.'%q_node' WHERE nodeno = ?1",

    /* Read and write the xxx_rowid table */
    "SELECT nodeno FROM '%q'.'%q_rowid' WHERE rowid = ?1",
    "INSERT OR REPLACE INTO '%q'.'%q_rowid' VALUES(?1, ?2)",
    "DELETE FROM '%q'.'%q_rowid' WHERE rowid = ?1",

    /* Read and write the xxx_parent table */
    "SELECT parentnode FROM '%q'.'%q_parent' WHERE nodeno = ?1",
    "INSERT OR REPLACE INTO '%q'.'%q_parent' VALUES(?1, ?2)",
    "DELETE FROM '%q'.'%q_parent' WHERE nodeno = ?1"
  };
  sqlite3_stmt **appStmt[N_STATEMENT];
  int i;
  const int f = SQLITE_PREPARE_PERSISTENT|SQLITE_PREPARE_NO_VTAB;

  pRtree->db = db;

  if( isCreate ){
    char *zCreate;
    sqlite3_str *p = sqlite3_str_new(db);
    int ii;
    sqlite3_str_appendf(p,
       "CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno",
       zDb, zPrefix);
    for(ii=0; ii<pRtree->nAux; ii++){
      sqlite3_str_appendf(p,",a%d",ii);
    }
    sqlite3_str_appendf(p,
      ");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);",
      zDb, zPrefix);
    sqlite3_str_appendf(p,
    "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);",
      zDb, zPrefix);
    sqlite3_str_appendf(p,
       "INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",
       zDb, zPrefix, pRtree->iNodeSize);
    zCreate = sqlite3_str_finish(p);
    if( !zCreate ){
      return SQLITE_NOMEM;
    }
    rc = sqlite3_exec(db, zCreate, 0, 0, 0);
    sqlite3_free(zCreate);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }

  appStmt[0] = &pRtree->pWriteNode;
  appStmt[1] = &pRtree->pDeleteNode;
  appStmt[2] = &pRtree->pReadRowid;
  appStmt[3] = &pRtree->pWriteRowid;
  appStmt[4] = &pRtree->pDeleteRowid;
  appStmt[5] = &pRtree->pReadParent;
  appStmt[6] = &pRtree->pWriteParent;
  appStmt[7] = &pRtree->pDeleteParent;

  rc = rtreeQueryStat1(db, pRtree);
  for(i=0; i<N_STATEMENT && rc==SQLITE_OK; i++){
    char *zSql;
    const char *zFormat;
    if( i!=3 || pRtree->nAux==0 ){
       zFormat = azSql[i];
    }else {
       /* An UPSERT is very slightly slower than REPLACE, but it is needed
       ** if there are auxiliary columns */
       zFormat = "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)"
                  "ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno";
    }
    zSql = sqlite3_mprintf(zFormat, zDb, zPrefix);
    if( zSql ){
      rc = sqlite3_prepare_v3(db, zSql, -1, f, appStmt[i], 0);
    }else{
      rc = SQLITE_NOMEM;
    }
    sqlite3_free(zSql);
  }
  if( pRtree->nAux && rc!=SQLITE_NOMEM ){
    pRtree->zReadAuxSql = sqlite3_mprintf(
       "SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",
       zDb, zPrefix);
    if( pRtree->zReadAuxSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      sqlite3_str *p = sqlite3_str_new(db);
      int ii;
      char *zSql;
      sqlite3_str_appendf(p, "UPDATE \"%w\".\"%w_rowid\"SET ", zDb, zPrefix);
      for(ii=0; ii<pRtree->nAux; ii++){
        if( ii ) sqlite3_str_append(p, ",", 1);
#ifdef SQLITE_ENABLE_GEOPOLY
        if( ii<pRtree->nAuxNotNull ){
          sqlite3_str_appendf(p,"a%d=coalesce(?%d,a%d)",ii,ii+2,ii);
        }else
#endif
        {
          sqlite3_str_appendf(p,"a%d=?%d",ii,ii+2);
        }
      }
      sqlite3_str_appendf(p, " WHERE rowid=?1");
      zSql = sqlite3_str_finish(p);
      if( zSql==0 ){
        rc = SQLITE_NOMEM;
      }else{
        rc = sqlite3_prepare_v3(db, zSql, -1, f, &pRtree->pWriteAux, 0);
        sqlite3_free(zSql);
      }
    }
  }

  return rc;
}